

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_writer.cc
# Opt level: O3

void __thiscall tcmalloc::StringGenericWriter::~StringGenericWriter(StringGenericWriter *this)

{
  ~StringGenericWriter(this);
  operator_delete__(this,0x30);
  return;
}

Assistant:

StringGenericWriter::~StringGenericWriter() {
  FinalRecycle();
  if (unused_size_) {
    s_->resize(s_->size() - unused_size_);
  }
}